

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

Array<char> * __thiscall
kj::Vector<char>::releaseAsArray(Array<char> *__return_storage_ptr__,Vector<char> *this)

{
  RemoveConst<char> *pRVar1;
  char *pcVar2;
  ArrayDisposer *pAVar3;
  Array<char> *result;
  
  pRVar1 = (this->builder).pos;
  if (pRVar1 != (this->builder).endPtr) {
    setCapacity(this,(long)pRVar1 - (long)(this->builder).ptr);
  }
  pcVar2 = (this->builder).ptr;
  pRVar1 = (this->builder).pos;
  pAVar3 = (this->builder).disposer;
  __return_storage_ptr__->ptr = pcVar2;
  __return_storage_ptr__->size_ = (long)pRVar1 - (long)pcVar2;
  __return_storage_ptr__->disposer = pAVar3;
  (this->builder).ptr = (char *)0x0;
  (this->builder).pos = (RemoveConst<char> *)0x0;
  (this->builder).endPtr = (char *)0x0;
  return __return_storage_ptr__;
}

Assistant:

inline Array<T> releaseAsArray() {
    // TODO(perf):  Avoid a copy/move by allowing Array<T> to point to incomplete space?
    if (!builder.isFull()) {
      setCapacity(size());
    }
    return builder.finish();
  }